

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_MarkCheckingPeriodLeaksAsNonCheckingPeriod_TestShell::
~TEST_MemoryLeakDetectorTest_MarkCheckingPeriodLeaksAsNonCheckingPeriod_TestShell
          (TEST_MemoryLeakDetectorTest_MarkCheckingPeriodLeaksAsNonCheckingPeriod_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, MarkCheckingPeriodLeaksAsNonCheckingPeriod)
{
    char* mem = detector->allocMemory(defaultNewArrayAllocator(), 100);
    char* mem2 = detector->allocMemory(defaultNewArrayAllocator(), 100);
    detector->stopChecking();
    LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_checking));
    LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_all));
    detector->markCheckingPeriodLeaksAsNonCheckingPeriod();
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_checking));
    LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_all));
    PlatformSpecificFree(mem);
    PlatformSpecificFree(mem2);
}